

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

void slang::
     function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
     ::
     callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__1>
               (intptr_t callable,char params,unsigned_long params_1,unsigned_long params_2,
               FormatOptions *params_3)

{
  FormatOptions *in_stack_00000050;
  size_t in_stack_00000058;
  size_t in_stack_00000060;
  char in_stack_0000006f;
  anon_class_40_5_766a4b66 *in_stack_00000070;
  
  ast::checkFormatString::anon_class_40_5_766a4b66::operator()
            (in_stack_00000070,in_stack_0000006f,in_stack_00000060,in_stack_00000058,
             in_stack_00000050);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }